

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeachCli.hpp
# Opt level: O1

void __thiscall peach::cli::PeachCli::~PeachCli(PeachCli *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  pointer pcVar3;
  
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&this->scope_);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~vector(&this->keywords_);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int_&,_int)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int_&,_int)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->interpreter_).assignOperatorFunction_._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<int_(std::vector<int,_std::allocator<int>_>)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<int_(std::vector<int,_std::allocator<int>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->interpreter_).operatorFunction_._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->interpreter_).operatorPriority_._M_h);
  std::
  deque<peach::interpreter::Interpreter::UnfinishedExpression,_std::allocator<peach::interpreter::Interpreter::UnfinishedExpression>_>
  ::~deque(&(this->interpreter_).unfinishedExpressions_.c);
  puVar2 = (this->interpreter_).singleIndentationBlock_.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->interpreter_).singleIndentationBlock_.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  pcVar3 = (this->tokenizator_).currentToken_._M_dataplus._M_p;
  paVar1 = &(this->tokenizator_).currentToken_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  std::
  vector<std::unique_ptr<peach::fsm::FiniteStateMachine,_std::default_delete<peach::fsm::FiniteStateMachine>_>,_std::allocator<std::unique_ptr<peach::fsm::FiniteStateMachine,_std::default_delete<peach::fsm::FiniteStateMachine>_>_>_>
  ::~vector((vector<std::unique_ptr<peach::fsm::FiniteStateMachine,_std::default_delete<peach::fsm::FiniteStateMachine>_>,_std::allocator<std::unique_ptr<peach::fsm::FiniteStateMachine,_std::default_delete<peach::fsm::FiniteStateMachine>_>_>_>
             *)this);
  return;
}

Assistant:

PeachCli()
        : interpreter_(std::vector<token::tokenCategory_t>{
                           token::tokenCategory::SEP_TAB,
                       },
                       {
                           {
                               [](peach::expression::PeachTuple args) {
                                   return !args[0];
                               },
                               "!",
                               token::tokenCategory::OPERATOR_UN,
                           },
                           {
                               [](peach::expression::PeachTuple args) {
                                   expression::VType res = 1;
                                   expression::VType deg = args[1];
                                   expression::VType x = args[0];
                                   while (deg)
                                   {
                                       if (!(deg & 1))
                                       {
                                           x *= x;
                                           deg >>= 1;
                                       }
                                       else
                                       {
                                           res *= x;
                                           --deg;
                                       }
                                   }
                                   return res;
                               },
                               "**",
                               token::tokenCategory::OPERATOR_BI,
                           },
                           {
                               [](peach::expression::PeachTuple args) {
                                   return args[0] * args[1];
                               },
                               "*",
                               token::tokenCategory::OPERATOR_BI,
                           },
                           {
                               [](peach::expression::PeachTuple args) {
                                   if (args[1] == 0)
                                   {
                                       throw exception::ZeroDivisionError();
                                   }
                                   return args[0] / args[1];
                               },
                               "/",
                               token::tokenCategory::OPERATOR_BI,
                           },
                           {
                               [](peach::expression::PeachTuple args) {
                                   return args[0] % args[1];
                               },
                               "%",
                               token::tokenCategory::OPERATOR_BI,
                           },
                           {
                               [](peach::expression::PeachTuple args) {
                                   return args[0] + args[1];
                               },
                               "+",
                               token::tokenCategory::OPERATOR_BI,
                           },
                           {
                               [](peach::expression::PeachTuple args) {
                                   return args[0] - args[1];
                               },
                               "-",
                               token::tokenCategory::OPERATOR_BI,
                           },
                           {
                               [](peach::expression::PeachTuple args) {
                                   return args[0] == args[1];
                               },
                               "==",
                               token::tokenCategory::OPERATOR_BI,
                           },
                           {
                               [](peach::expression::PeachTuple args) {
                                   return args[0] != args[1];
                               },
                               "!=",
                               token::tokenCategory::OPERATOR_BI,
                           },
                           {
                               [](peach::expression::PeachTuple args) {
                                   return args[0] > args[1];
                               },
                               ">",
                               token::tokenCategory::OPERATOR_BI,
                           },
                           {
                               [](peach::expression::PeachTuple args) {
                                   return args[0] >= args[1];
                               },
                               ">=",
                               token::tokenCategory::OPERATOR_BI,
                           },
                           {
                               [](peach::expression::PeachTuple args) {
                                   return args[0] < args[1];
                               },
                               "<",
                               token::tokenCategory::OPERATOR_BI,
                           },
                           {
                               [](peach::expression::PeachTuple args) {
                                   return args[0] <= args[1];
                               },
                               "<=",
                               token::tokenCategory::OPERATOR_BI,
                           },
                           {
                               [](peach::expression::PeachTuple args) {
                                   return args[0] || args[1];
                               },
                               "|",
                               token::tokenCategory::OPERATOR_BI,
                           },
                           {
                               [](peach::expression::PeachTuple args) {
                                   return args[0] && args[1];
                               },
                               "&",
                               token::tokenCategory::OPERATOR_BI,
                           },
                       },
                       {
                           {
                               [](peach::expression::VType &left, peach::expression::VType right) {
                                   left = right;
                               },
                               "=",
                               token::tokenCategory::ASSIGNMENT,
                           },
                           {
                               [](peach::expression::VType &left, peach::expression::VType right) {
                                   left += right;
                               },
                               "+=",
                               token::tokenCategory::ASSIGNMENT,
                           },
                           {
                               [](peach::expression::VType &left, peach::expression::VType right) {
                                   left -= right;
                               },
                               "-=",
                               token::tokenCategory::ASSIGNMENT,
                           },
                           {
                               [](peach::expression::VType &left, peach::expression::VType right) {
                                   left *= right;
                               },
                               "*=",
                               token::tokenCategory::ASSIGNMENT,
                           },
                           {
                               [](peach::expression::VType &left, peach::expression::VType right) {
                                   left /= right;
                               },
                               "/=",
                               token::tokenCategory::ASSIGNMENT,
                           },
                           {
                               [](peach::expression::VType &left, peach::expression::VType right) {
                                   left %= right;
                               },
                               "%=",
                               token::tokenCategory::ASSIGNMENT,
                           },
                           {
                               [](peach::expression::VType &left, peach::expression::VType right) {
                                   left &= right;
                               },
                               "&=",
                               token::tokenCategory::ASSIGNMENT,
                           },
                           {
                               [](peach::expression::VType &left, peach::expression::VType right) {
                                   left |= right;
                               },
                               "|=",
                               token::tokenCategory::ASSIGNMENT,
                           },
                       }),
          keywords_({
              {"if", token::tokenCategory::COND_IF},
              {"else", token::tokenCategory::COND_ELSE},
              {"while", token::tokenCategory::LOOP_WHILE},
              {"let", token::tokenCategory::DECLARATION},
          })

    {
        using peach::token::tokenCategory;
        using peach::token::tokenCategory_t;
        using namespace peach::transition;
        tokenizator_
            .buildAppendFsm<peach::fsm::NameFinder>()                                     //
            .buildAppendFsm<peach::fsm::NumberFinder>(tokenCategory::VALUE_FLOATING, '.') //
            .buildAppendFsm<peach::fsm::NumberFinder>(tokenCategory::VALUE_INT)           //
            .buildAppendFsm<peach::fsm::OperatorFinder>(
                std::vector<std::pair<std::string, tokenCategory_t>>{
                    {"&=", tokenCategory::ASSIGNMENT},
                    {"&", tokenCategory::OPERATOR_BI},
                    {"|=", tokenCategory::ASSIGNMENT},
                    {"|", tokenCategory::OPERATOR_BI},
                    {"*=", tokenCategory::ASSIGNMENT},
                    {"**", tokenCategory::OPERATOR_BI},
                    {"*", tokenCategory::OPERATOR_BI},
                    {"/=", tokenCategory::ASSIGNMENT},
                    {"/", tokenCategory::OPERATOR_BI},
                    {"%=", tokenCategory::ASSIGNMENT},
                    {"%", tokenCategory::OPERATOR_BI},
                    {"+=", tokenCategory::ASSIGNMENT},
                    {"+", tokenCategory::OPERATOR_BI},
                    {"-=", tokenCategory::ASSIGNMENT},
                    {"-", tokenCategory::OPERATOR_BI},
                    {"==", tokenCategory::OPERATOR_BI},
                    {"=", tokenCategory::ASSIGNMENT},
                    {"!=", tokenCategory::OPERATOR_BI},
                    {"!", tokenCategory::OPERATOR_UN},
                    {">", tokenCategory::OPERATOR_BI},
                    {"<", tokenCategory::OPERATOR_BI},
                    {">=", tokenCategory::OPERATOR_BI},
                    {"<=", tokenCategory::OPERATOR_BI},
                }) //
            .buildAppendFsm<peach::fsm::SingleCharFinder>(
                std::vector<std::pair<char, tokenCategory_t>>{
                    {'\n', tokenCategory::SEP_ENDL},
                    {' ', tokenCategory::SEP_SPACE},
                    {'\t', tokenCategory::SEP_TAB},
                    {'(', tokenCategory::BRACKET_OPEN},
                    {')', tokenCategory::BRACKET_CLOSE},
                }) //
            ;
    }